

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supdup.c
# Opt level: O2

void supdup_receive(Plug *plug,int urgent,char *data,size_t len)

{
  byte val;
  char cVar1;
  PlugVtable *pPVar2;
  char cVar3;
  strbuf *buf_o;
  char *pcVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  BinarySink *bs;
  uchar val_00;
  uint uVar9;
  size_t sVar10;
  undefined2 local_56;
  char buf [4];
  undefined4 local_50;
  int x;
  Supdup *local_48;
  char *local_40;
  size_t local_38;
  
  local_48 = (Supdup *)(plug + -0x12);
  local_38 = len;
  buf_o = strbuf_new();
  bs = buf_o->binarysink_;
  sVar10 = 0;
  local_40 = data;
  do {
    if (local_38 == sVar10) {
      if (buf_o->len != 0) {
        c_write(local_48,buf_o->u,(int)buf_o->len);
      }
      strbuf_free(buf_o);
      return;
    }
    val = data[sVar10];
    iVar6 = *(int *)((long)&plug[-6].vt + 4);
    if (iVar6 != 1) {
      if (iVar6 == 0) {
        if (val == 0x88) {
          *(undefined8 *)((long)&plug[-6].vt + 4) = 1;
        }
        else {
          BinarySink_put_byte(bs,val);
        }
      }
      goto LAB_00138588;
    }
    iVar6 = *(int *)&plug[-5].vt;
    if (iVar6 != 1) {
      if (iVar6 != 0) goto LAB_00138394;
      uVar9 = (uint)val;
      if (-1 < (char)val) {
        (*(code *)plug[-2].vt)(buf_o);
switchD_00138382_caseD_85:
        iVar6 = *(int *)&plug[-5].vt;
        goto LAB_00138394;
      }
      *(undefined4 *)&plug[-3].vt = 0;
      *(uint *)((long)&plug[-5].vt + 4) = (uint)val;
      switch(val) {
      case 0x80:
        *(undefined4 *)&plug[-4].vt = 4;
        break;
      case 0x81:
      case 0x8f:
        *(undefined4 *)&plug[-4].vt = 2;
        break;
      case 0x82:
      case 0x83:
      case 0x84:
      case 0x87:
      case 0x88:
      case 0x89:
      case 0x8a:
      case 0x8b:
      case 0x8c:
      case 0x8e:
      case 0x90:
      case 0x91:
      case 0x97:
      case 0x98:
        *(undefined4 *)&plug[-4].vt = 0;
        *(undefined4 *)&plug[-5].vt = 2;
        goto LAB_001383a0;
      default:
        goto switchD_00138382_caseD_85;
      case 0x8d:
      case 0x93:
      case 0x94:
      case 0x95:
      case 0x96:
        *(undefined4 *)&plug[-4].vt = 1;
        *(undefined4 *)&plug[-5].vt = 1;
        goto LAB_0013852f;
      }
      *(undefined4 *)&plug[-5].vt = 1;
      goto LAB_0013852f;
    }
    iVar6 = 0;
    if ((long)*(int *)&plug[-3].vt < 4) {
      *(byte *)((long)plug + (long)*(int *)&plug[-3].vt + -0x1c) = val;
      iVar7 = *(int *)&plug[-3].vt + 1;
      *(int *)&plug[-3].vt = iVar7;
      iVar6 = 2;
      if (*(int *)&plug[-4].vt != iVar7) goto switchD_00138382_caseD_85;
    }
    *(int *)&plug[-5].vt = iVar6;
LAB_00138394:
    if (iVar6 != 2) goto LAB_0013852f;
    uVar9 = *(uint *)((long)&plug[-5].vt + 4);
LAB_001383a0:
    switch(uVar9) {
    case 0x80:
      cVar3 = *(char *)((long)&plug[-4].vt + 6);
      cVar1 = *(char *)((long)&plug[-4].vt + 7);
      goto LAB_0013846f;
    case 0x81:
    case 0x8f:
      cVar3 = *(char *)((long)&plug[-4].vt + 4);
      cVar1 = *(char *)((long)&plug[-4].vt + 5);
LAB_0013846f:
      BinarySink_put_fmt(bs,"\x1b[%d;%dH",(ulong)((int)cVar3 + 1),(ulong)((int)cVar1 + 1));
      goto switchD_001383ba_caseD_85;
    case 0x82:
      pcVar4 = "\x1b[J";
      break;
    case 0x83:
      pcVar4 = "\x1b[K";
      break;
    case 0x84:
      pcVar4 = "\x1b[X";
      break;
    default:
      goto switchD_001383ba_caseD_85;
    case 0x87:
      pcVar4 = "\r\n";
      break;
    case 0x89:
      val_00 = '\b';
      goto LAB_001384ca;
    case 0x8a:
      val_00 = '\n';
      goto LAB_001384ca;
    case 0x8b:
      val_00 = '\r';
      goto LAB_001384ca;
    case 0x8c:
      buf_o->len = 0;
      cVar3 = (**(code **)((plug[-0x10].vt)->log + 0xd8))(plug[-0x10].vt,&x,&local_50);
      if (cVar3 == '\0') {
        local_50 = 0;
        x = 0;
        x._0_1_ = '\0';
        buf[2] = '\0';
      }
      else {
        buf[2] = (char)local_50;
      }
      buf[0] = '\x1c';
      buf[1] = '\x10';
      buf[3] = (char)x;
      (*local_48->s->vt->write)(local_48->s,buf,4);
      goto switchD_001383ba_caseD_85;
    case 0x8d:
      val_00 = *(uchar *)((long)&plug[-4].vt + 4);
LAB_001384ca:
      BinarySink_put_byte(bs,val_00);
      goto switchD_001383ba_caseD_85;
    case 0x8e:
      pcVar4 = "\x1b[C";
      break;
    case 0x90:
      pcVar4 = "\x1b[2J\x1b[H";
      break;
    case 0x91:
      pcVar4 = "\a";
      break;
    case 0x93:
      uVar8 = (ulong)(uint)(int)*(char *)((long)&plug[-4].vt + 4);
      pcVar4 = "\x1b[%dL";
      goto LAB_001384ef;
    case 0x94:
      uVar8 = (ulong)(uint)(int)*(char *)((long)&plug[-4].vt + 4);
      pcVar4 = "\x1b[%dM";
      goto LAB_001384ef;
    case 0x95:
      uVar8 = (ulong)(uint)(int)*(char *)((long)&plug[-4].vt + 4);
      pcVar4 = "\x1b[%d@";
      goto LAB_001384ef;
    case 0x96:
      uVar8 = (ulong)(uint)(int)*(char *)((long)&plug[-4].vt + 4);
      pcVar4 = "\x1b[%dP";
LAB_001384ef:
      BinarySink_put_fmt(bs,pcVar4,uVar8);
      goto switchD_001383ba_caseD_85;
    }
    BinarySink_put_fmt(bs,pcVar4);
switchD_001383ba_caseD_85:
    *(undefined4 *)&plug[-5].vt = 0;
LAB_0013852f:
    if (*(char *)&plug[-8].vt == '\0') {
      local_56 = 0xc2c0;
      pcVar4 = conf_get_str((Conf *)plug[-7].vt,0x44);
      (**(code **)((plug[-0x12].vt)->log + 0x10))(plug[-0x12].vt,&local_56,2);
      pPVar2 = plug[-0x12].vt;
      sVar5 = strlen(pcVar4);
      data = local_40;
      (**(code **)(pPVar2->log + 0x10))(pPVar2,pcVar4,sVar5 + 1);
      *(undefined1 *)&plug[-8].vt = 1;
    }
LAB_00138588:
    if (0xfff < buf_o->len) {
      c_write(local_48,buf_o->u,(int)buf_o->len);
      buf_o->len = 0;
    }
    sVar10 = sVar10 + 1;
  } while( true );
}

Assistant:

static void supdup_receive(Plug *plug, int urgent, const char *data, size_t len)
{
    Supdup *supdup = container_of(plug, Supdup, plug);
    do_supdup_read(supdup, data, len);
}